

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

char * sysbvm_system_getAbiName(void)

{
  return "gnu";
}

Assistant:

SYSBVM_API const char *sysbvm_system_getAbiName(void)
{
#if defined(_WIN32)
    return "win32";
#elif defined(__APPLE__)
    return "darwin";
#elif defined(__linux__) || defined(unix)
    return "gnu";
#else
    #error "Unknown platform";
#endif
}